

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dag.cpp
# Opt level: O2

bool __thiscall DAGPropagator::propagateNewEdge(DAGPropagator *this,int e)

{
  pointer pTVar1;
  pointer pTVar2;
  int *piVar3;
  pointer pvVar4;
  uint *puVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  size_type __n;
  uint *puVar9;
  reference rVar10;
  
  bVar6 = DReachabilityPropagator::propagateNewEdge(&this->super_DReachabilityPropagator,e);
  if ((bVar6) &&
     (iVar7 = (*(this->super_DReachabilityPropagator).super_GraphPropagator.super_Propagator.
                _vptr_Propagator[0x18])(this,e), (char)iVar7 != '\0')) {
    __n = (size_type)e;
    pTVar2 = (this->succs).
             super__Vector_base<DAGPropagator::TrailedSuccList,_std::allocator<DAGPropagator::TrailedSuccList>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar3 = (this->super_DReachabilityPropagator).super_GraphPropagator.endnodes.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[__n].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    iVar7 = *piVar3;
    pTVar1 = pTVar2 + iVar7;
    lVar8 = (long)pTVar2[iVar7].super_TrailedConstantAccessList<std::pair<int,_int>,_Tint>.size.v;
    connectTo(this,iVar7,piVar3[1]);
    rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->processed_e,__n);
    *rVar10._M_p = *rVar10._M_p | rVar10._M_mask;
    while( true ) {
      pTVar2 = (this->succs).
               super__Vector_base<DAGPropagator::TrailedSuccList,_std::allocator<DAGPropagator::TrailedSuccList>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar7 = *(this->super_DReachabilityPropagator).super_GraphPropagator.endnodes.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[__n].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      if ((pTVar1 == pTVar2 + iVar7) &&
         (pTVar2[iVar7].super_TrailedConstantAccessList<std::pair<int,_int>,_Tint>.size.v ==
          (int)lVar8)) break;
      iVar7 = *(int *)(*(long *)&(pTVar1->super_TrailedConstantAccessList<std::pair<int,_int>,_Tint>
                                 ).dense.
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 ._M_impl.super__Vector_impl_data + lVar8 * 8);
      pvVar4 = (this->super_DReachabilityPropagator).ou.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar5 = (uint *)pvVar4[iVar7].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
      for (puVar9 = *(uint **)&pvVar4[iVar7].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data; puVar9 != puVar5; puVar9 = puVar9 + 1) {
        (*(this->super_DReachabilityPropagator).super_GraphPropagator.super_Propagator.
          _vptr_Propagator[0x19])(this,(ulong)*puVar9);
      }
      lVar8 = lVar8 + 1;
    }
    return true;
  }
  return false;
}

Assistant:

bool DAGPropagator::propagateNewEdge(int e) {
	if (!DReachabilityPropagator::propagateNewEdge(e)) {
		return false;
	}

	if (!check_cycle(e)) {
		return false;
	}

	TrailedSuccList::const_iterator succ_taile = succs[getTail(e)].end();
	connectTo(getTail(e), getHead(e));
	processed_e[e] = true;

	// Only checking the new ones
	for (; succ_taile != succs[getTail(e)].end(); succ_taile++) {
		const int n = (*succ_taile).first;
		for (const int i : ou[n]) {
			prevent_cycle(i);
		}
	}
	/*
	//Check all reachable
	for (int n = 0; n < nbNodes(); n++) {
			if (reachable(n,getTail(e))) {
					for (int i = 0; i < in[n].size(); i++) {
							assert(!prevent_cycle(in[n][i])); //Assert because already checked before
					}
			}
	}
	*/

	/*    cout <<"Start "<<e<<endl;
	for (int i = 0; i < nbNodes(); i++) {
			for (int j = 0; j < nbNodes(); j++) {
					cout << reachability[i][j]<<",";
			}
			cout <<endl;
			}*/

	return true;
}